

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

mg_dns_resource_record *
mg_dns_next_record(mg_dns_message *msg,int query,mg_dns_resource_record *prev)

{
  mg_dns_resource_record *pmVar1;
  long lVar2;
  long lVar3;
  
  pmVar1 = prev + 1;
  if (prev == (mg_dns_resource_record *)0x0) {
    pmVar1 = msg->answers;
  }
  if (((long)pmVar1 - (long)msg->answers >> 4) * -0x5555555555555555 < (long)msg->num_answers) {
    lVar3 = (long)pmVar1 + (-0x5f0 - (long)msg);
    do {
      if (pmVar1->rtype == query) {
        return pmVar1;
      }
      pmVar1 = pmVar1 + 1;
      lVar2 = lVar3 >> 4;
      lVar3 = lVar3 + 0x30;
    } while (lVar2 * -0x5555555555555555 < (long)msg->num_answers);
  }
  return (mg_dns_resource_record *)0x0;
}

Assistant:

struct mg_dns_resource_record *mg_dns_next_record(
        struct mg_dns_message *msg, int query,
        struct mg_dns_resource_record *prev) {
    struct mg_dns_resource_record *rr;

    for (rr = (prev == NULL ? msg->answers : prev + 1);
         rr - msg->answers < msg->num_answers; rr++) {
        if (rr->rtype == query) {
            return rr;
        }
    }
    return NULL;
}